

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

bool __thiscall minihttp::TcpSocket::SendBytes(TcpSocket *this,void *str,uint len)

{
  ssize_t sVar1;
  bool bVar2;
  void *__buf;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  bVar2 = true;
  if (len != 0) {
    lVar3 = this->_s;
    uVar5 = 0;
    if (lVar3 != -1) {
      do {
        __buf = (void *)(uVar5 + (long)str);
        sVar1 = send((int)lVar3,__buf,(ulong)(len - (int)uVar5),0x4000);
        uVar4 = (uint)sVar1;
        if ((int)uVar4 < 1) {
          if ((int)uVar4 < 0) {
            close(this,(int)__buf);
            break;
          }
        }
        else {
          if (len < uVar4) {
            __assert_fail("(unsigned)ret <= len",
                          "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                          ,0x291,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
          }
          uVar4 = (int)uVar5 + uVar4;
          uVar5 = (ulong)uVar4;
          if (len <= uVar4) {
            if (uVar4 == len) {
              return true;
            }
            __assert_fail("written == len",
                          "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                          ,0x2a0,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
          }
        }
        lVar3 = this->_s;
      } while( true );
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TcpSocket::SendBytes(const void *str, unsigned int len)
{
    if(!len)
        return true;
    if(!SOCKETVALID(_s))
        return false;
    //traceprint("SEND: '%s'\n", str);

    unsigned written = 0;
    while(true) // FIXME: buffer bytes to an internal queue instead?
    {
        int ret = _writeBytes((const unsigned char*)str + written, len - written);
        if(ret > 0)
        {
            assert((unsigned)ret <= len);
            written += (unsigned)ret;
            if(written >= len)
                break;
        }
        else if(ret < 0)
        {
            int err = ret == -1 ? _GetError() : ret;
            traceprint("SendBytes: error %d: %s\n", err, _GetErrorStr(err).c_str());
            close();
            return false;
        }
        // and if ret == 0, keep trying.
    }

    assert(written == len);
    return true;
}